

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiInputEvent>::push_back(ImVector<ImGuiInputEvent> *this,ImGuiInputEvent *v)

{
  ImGuiInputEvent *pIVar1;
  ImGuiInputEventMousePos IVar2;
  ImGuiInputSource IVar3;
  int iVar4;
  int iVar5;
  int new_capacity;
  
  iVar5 = this->Size;
  if (iVar5 == this->Capacity) {
    if (iVar5 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar5 / 2 + iVar5;
    }
    new_capacity = iVar5 + 1;
    if (iVar5 + 1 < iVar4) {
      new_capacity = iVar4;
    }
    reserve(this,new_capacity);
    iVar5 = this->Size;
  }
  pIVar1 = this->Data;
  *(undefined8 *)((long)&pIVar1[iVar5].field_2 + 8) = *(undefined8 *)((long)&v->field_2 + 8);
  IVar3 = v->Source;
  IVar2 = (v->field_2).MousePos;
  pIVar1 = pIVar1 + iVar5;
  pIVar1->Type = v->Type;
  pIVar1->Source = IVar3;
  (pIVar1->field_2).MousePos = IVar2;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }